

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O3

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  Mat *pMVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  void *pvVar5;
  Allocator *pAVar6;
  long *plVar7;
  ulong uVar8;
  int _h;
  undefined4 *puVar9;
  int *piVar10;
  Layer *pLVar11;
  int _w;
  long lVar12;
  undefined4 *puVar13;
  ulong uVar14;
  long lVar15;
  _func_int *p_Var16;
  int iVar17;
  undefined4 *puVar18;
  undefined4 *puVar19;
  ParamDict permute_pd;
  ParamDict pd;
  ParamDict PStack_148;
  ParamDict local_138;
  Mat local_128;
  undefined8 local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined8 local_a0;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  void *local_38;
  
  pMVar1 = (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86[-3]);
  iVar17 = (int)pMVar1[-2].elemsize;
  _w = pMVar1[-2].elempack * *(int *)((long)&pMVar1[-2].elemsize + 4);
  uVar8 = (long)(int)pMVar1[-2].cstep / (long)(_w * iVar17);
  _h = (int)uVar8;
  Mat::reshape(&local_98,pMVar1,_w,_h,iVar17,(Allocator *)0x0);
  pMVar1 = &this->weight_data_t;
  p_Var16 = this->_vptr_DeformableConv2D_x86[-3];
  Mat::create(pMVar1,_h,
              *(int *)(&this->field_0xd8 + (long)p_Var16) *
              *(int *)(&this->field_0xd4 + (long)p_Var16),
              *(int *)(&this->field_0xd0 + (long)p_Var16),4,(Allocator *)0x0);
  local_38 = pMVar1->data;
  iVar17 = -100;
  if ((local_38 != (void *)0x0) &&
     (sVar2 = (this->weight_data_t).cstep, (long)(this->weight_data_t).c * sVar2 != 0)) {
    pp_Var3 = this->_vptr_DeformableConv2D_x86;
    p_Var16 = pp_Var3[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var16)) {
      sVar4 = (this->weight_data_t).elemsize;
      lVar15 = 0;
      puVar9 = (undefined4 *)local_98.data;
      do {
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var16) *
                *(int *)(&this->field_0xd4 + (long)p_Var16)) {
          puVar18 = (undefined4 *)(sVar2 * sVar4 * lVar15 + (long)local_38);
          lVar12 = 0;
          puVar13 = puVar9;
          do {
            uVar14 = uVar8 & 0xffffffff;
            puVar19 = puVar13;
            if (0 < _h) {
              do {
                *puVar18 = *puVar19;
                puVar18 = puVar18 + 1;
                puVar19 = (undefined4 *)
                          ((long)puVar19 +
                          (long)local_98.w *
                          CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
              p_Var16 = pp_Var3[-3];
            }
            lVar12 = lVar12 + 1;
            puVar13 = puVar13 + 1;
          } while (lVar12 < (long)*(int *)(&this->field_0xd8 + (long)p_Var16) *
                            (long)*(int *)(&this->field_0xd4 + (long)p_Var16));
        }
        lVar15 = lVar15 + 1;
        puVar9 = (undefined4 *)
                 ((long)puVar9 +
                 CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * local_98.cstep);
      } while (lVar15 < *(int *)(&this->field_0xd0 + (long)p_Var16));
    }
    piVar10 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    local_48 = pMVar1;
    local_40 = opt;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    p_Var16 = this->_vptr_DeformableConv2D_x86[-3];
    Mat::reshape(&local_128,pMVar1,
                 _h * *(int *)(&this->field_0xd4 + (long)p_Var16) *
                 *(int *)(&this->field_0xd8 + (long)p_Var16),
                 *(int *)(&this->field_0xd0 + (long)p_Var16),(Allocator *)0x0);
    piVar10 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (pMVar1 != &local_128) {
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      piVar10 = (this->weight_data_t).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pvVar5 = (this->weight_data_t).data;
          pAVar6 = (this->weight_data_t).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_t).data = local_128.data;
      piVar10 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      (this->weight_data_t).refcount = piVar10;
      (this->weight_data_t).elemsize =
           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      (this->weight_data_t).elempack = local_128.elempack;
      (this->weight_data_t).allocator = local_128.allocator;
      (this->weight_data_t).dims = local_128.dims;
      (this->weight_data_t).w = local_128.w;
      (this->weight_data_t).h = local_128.h;
      (this->weight_data_t).d = local_128.d;
      (this->weight_data_t).c = local_128.c;
      (this->weight_data_t).cstep = local_128.cstep;
    }
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pLVar11 = create_layer(0xf);
    this->inner_product = pLVar11;
    ParamDict::ParamDict(&local_138);
    ParamDict::set(&local_138,0,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&local_138,1,
                   *(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&local_138,2,
                   *(int *)(&this->field_0x100 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&local_138,9,
                   *(int *)(&this->field_0x104 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    ParamDict::set(&local_138,10,
                   (Mat *)(&this->field_0x108 + (long)this->_vptr_DeformableConv2D_x86[-3]));
    (*this->inner_product->_vptr_Layer[2])(this->inner_product,&local_138);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    if (&local_128 != pMVar1) {
      piVar10 = (this->weight_data_t).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_128.data = (this->weight_data_t).data;
      piVar10 = (this->weight_data_t).refcount;
      local_128.refcount._0_4_ = SUB84(piVar10,0);
      local_128.refcount._4_4_ = (undefined4)((ulong)piVar10 >> 0x20);
      sVar2 = (this->weight_data_t).elemsize;
      local_128.elemsize._0_4_ = (undefined4)sVar2;
      local_128.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      local_128.elempack = (this->weight_data_t).elempack;
      local_128.allocator = (this->weight_data_t).allocator;
      local_128.dims = (this->weight_data_t).dims;
      local_128.w = (this->weight_data_t).w;
      local_128.h = (this->weight_data_t).h;
      local_128.d = (this->weight_data_t).d;
      local_128.c = (this->weight_data_t).c;
      local_128.cstep = (this->weight_data_t).cstep;
    }
    local_a0 = 0;
    local_a8 = 0;
    uStack_ac = 0;
    uStack_b0 = 0;
    uStack_b4 = 0;
    uStack_b8 = 0;
    local_c0 = 0;
    local_c8 = 0;
    uStack_cc = 0;
    local_d0 = 0;
    uStack_d4 = 0;
    uStack_d8 = 0;
    local_e0 = 0;
    p_Var16 = this->_vptr_DeformableConv2D_x86[-3];
    if ((*(int *)(&this->field_0xfc + (long)p_Var16) != 0) &&
       (&local_e0 != (undefined8 *)(&this->field_0x198 + (long)p_Var16))) {
      piVar10 = *(int **)(&this->field_0x1a0 + (long)p_Var16);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_e0 = *(undefined8 *)(&this->field_0x198 + (long)p_Var16);
      uStack_d8 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var16);
      uStack_d4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var16) >> 0x20);
      local_d0 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var16);
      uStack_cc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var16) >> 0x20);
      local_c8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var16);
      local_c0 = *(undefined8 *)(&this->field_0x1b8 + (long)p_Var16);
      uStack_b8 = (undefined4)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var16);
      uStack_b4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var16) >> 0x20);
      uStack_b0 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var16);
      uStack_ac = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var16) >> 0x20);
      local_a8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var16);
      local_a0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var16);
    }
    pLVar11 = this->inner_product;
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_148,&local_128);
    (*pLVar11->_vptr_Layer[3])(pLVar11,&PStack_148);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_148);
    (*this->inner_product->_vptr_Layer[4])();
    pLVar11 = create_layer(0x2f);
    this->permute = pLVar11;
    ParamDict::ParamDict(&PStack_148);
    ParamDict::set(&PStack_148,0,1);
    (*this->permute->_vptr_Layer[2])(this->permute,&PStack_148);
    (*this->permute->_vptr_Layer[4])(this->permute,opt);
    ParamDict::~ParamDict(&PStack_148);
    lVar15 = 0x48;
    do {
      piVar10 = *(int **)((long)&local_128.refcount + lVar15);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pvVar5 = *(void **)((long)&local_128.data + lVar15);
          plVar7 = *(long **)((long)&local_128.allocator + lVar15);
          if (plVar7 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar7 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_128.cstep + lVar15) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_128.elemsize + lVar15 + 4) = 0;
      *(undefined8 *)((long)&local_128.data + lVar15) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar15) = 0;
      *(undefined8 *)((long)&local_128.dims + lVar15) = 0;
      *(undefined8 *)((long)&local_128.h + lVar15) = 0;
      *(undefined4 *)((long)&local_128.c + lVar15) = 0;
      lVar15 = lVar15 + -0x48;
    } while (lVar15 != -0x48);
    ParamDict::~ParamDict(&local_138);
    iVar17 = 0;
  }
  piVar10 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    const int in_c = weight_data_size / (num_output * kernel_h * kernel_w);
    {
        Mat weight_3d = weight_data.reshape(kernel_w * kernel_h, in_c, num_output);
        weight_data_t.create(in_c, kernel_w * kernel_h, num_output);
        if (weight_data_t.empty())
            return -100;
        for (int q = 0; q < num_output; q++)
        {
            const Mat m = weight_3d.channel(q);
            float* outptr = weight_data_t.channel(q);

            for (int i = 0; i < kernel_w * kernel_h; i++)
            {
                for (int j = 0; j < in_c; j++)
                {
                    *outptr++ = m.row(j)[i];
                }
            }
        }
        weight_3d.release();
        weight_data_t = weight_data_t.reshape(in_c * kernel_w * kernel_h, num_output);

        inner_product = ncnn::create_layer(ncnn::LayerType::InnerProduct);
        ncnn::ParamDict pd;
        pd.set(0, num_output);
        pd.set(1, bias_term);
        pd.set(2, weight_data_size);
        pd.set(9, activation_type);
        pd.set(10, activation_params);
        inner_product->load_param(pd);
        ncnn::Mat weights[2];
        weights[0] = weight_data_t;
        if (bias_term)
            weights[1] = bias_data;
        inner_product->load_model(ncnn::ModelBinFromMatArray(weights));
        inner_product->create_pipeline(opt);

        permute = ncnn::create_layer(ncnn::LayerType::Permute);
        ncnn::ParamDict permute_pd;
        permute_pd.set(0, 1);
        permute->load_param(permute_pd);
        permute->create_pipeline(opt);
    }

    return 0;
}